

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O2

void INT_CMCondition_set_client_data(CManager cm,int condition,void *client_data)

{
  CMControlList cl;
  CMCondition p_Var1;
  
  cl = cm->control_list;
  set_debug_flag(cm);
  p_Var1 = CMCondition_find(cl,condition);
  if (p_Var1 != (CMCondition)0x0) {
    p_Var1->client_data = client_data;
  }
  return;
}

Assistant:

extern void
INT_CMCondition_set_client_data(CManager cm, int condition, void *client_data)
{
    CMCondition cond;
    CMControlList cl = cm->control_list;
    set_debug_flag(cm);
    cond = CMCondition_find(cl, condition);
    if (!cond) return;
    cond->client_data = client_data;
}